

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

void __thiscall icu_63::ModulusSubstitution::toString(ModulusSubstitution *this,UnicodeString *text)

{
  int iVar1;
  UnicodeString *text_local;
  ModulusSubstitution *this_local;
  
  if (this->ruleToUse == (NFRule *)0x0) {
    NFSubstitution::toString(&this->super_NFSubstitution,text);
  }
  else {
    UnicodeString::remove(text,(char *)text);
    iVar1 = (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xd])();
    UnicodeString::append(text,(char16_t)iVar1);
    iVar1 = (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xd])();
    UnicodeString::append(text,(char16_t)iVar1);
    iVar1 = (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xd])();
    UnicodeString::append(text,(char16_t)iVar1);
  }
  return;
}

Assistant:

void
ModulusSubstitution::toString(UnicodeString& text) const
{
  // use tokenChar() to get the character at the beginning and
  // end of the substitutin token.  In between them will go
  // either the name of the rule set it uses, or the pattern of
  // the DecimalFormat it uses

  if ( ruleToUse != NULL ) { // Must have been a >>> substitution.
      text.remove();
      text.append(tokenChar());
      text.append(tokenChar());
      text.append(tokenChar());
  } else { // Otherwise just use the super-class function.
	  NFSubstitution::toString(text);
  }
}